

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

Matrix<float,_4,_4,_0,_4,_4> *
getGTTransformations<float>(Matrix<float,_4,_4,_0,_4,_4> *__return_storage_ptr__,bool verbose)

{
  DenseStorage<float,_16,_4,_4,_0> *pDVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  float *pfVar5;
  ActualDstType actualDst;
  undefined7 in_register_00000031;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Matrix<float,_3,_1,_0,_3,_1> tranGT;
  Matrix<float,_3,_3,_0,_3,_3> rotGT;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  RotationBase<Eigen::Quaternion<float,_0>,_3> *local_50;
  Matrix<float,3,3,0,3,3> local_44 [8];
  float afStack_3c [7];
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0] = 1.0;
  pDVar1 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar1->m_data).array[1] = 0.0;
  (pDVar1->m_data).array[2] = 0.0;
  pDVar1 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar1->m_data).array[3] = 0.0;
  (pDVar1->m_data).array[4] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[5] = 1.0;
  pDVar1 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar1->m_data).array[6] = 0.0;
  (pDVar1->m_data).array[7] = 0.0;
  pDVar1 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar1->m_data).array[8] = 0.0;
  (pDVar1->m_data).array[9] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[10] = 1.0;
  pDVar1 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar1->m_data).array[0xb] = 0.0;
  (pDVar1->m_data).array[0xc] = 0.0;
  pDVar1 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar1->m_data).array[0xd] = 0.0;
  (pDVar1->m_data).array[0xe] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xf] = 1.0;
  iVar2 = rand();
  fVar8 = (float)(iVar2 % 200) / 5.0;
  iVar2 = rand();
  fVar7 = (float)(iVar2 % 200) / 5.0;
  iVar2 = rand();
  fVar6 = (float)(iVar2 % 200) / 5.0;
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Rand() angles = (",0x11);
    poVar3 = std::ostream::_M_insert<double>((double)fVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    poVar3 = std::ostream::_M_insert<double>((double)fVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    poVar3 = std::ostream::_M_insert<double>((double)fVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  local_78 = ((fVar6 * 3.1415927) / 360.0) * 0.5;
  fVar6 = cosf(local_78);
  fStack_70 = sinf(local_78);
  local_78 = fStack_70 * 0.0;
  fVar7 = ((fVar7 * 3.1415927) / 360.0) * 0.5;
  fStack_74 = local_78;
  fStack_6c = fVar6;
  local_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = fStack_70;
  fVar6 = cosf(fVar7);
  fVar7 = sinf(fVar7);
  fVar9 = fVar7 * 0.0;
  fVar10 = fVar9 * fStack_6c + fVar9 * fStack_64 + (fVar6 * local_78 - fVar7 * fStack_60);
  fVar11 = fVar7 * fStack_6c + fVar9 * fStack_60 + (fVar6 * fStack_74 - fVar9 * local_68);
  fVar12 = fVar9 * fStack_6c + fVar7 * local_68 + (fVar6 * fStack_70 - fVar9 * fStack_64);
  fVar9 = -(fVar7 * fStack_74 + fVar9 * fStack_60) + (fVar6 * fStack_6c - fVar9 * local_68);
  fVar8 = ((fVar8 * 3.1415927) / 360.0) * 0.5;
  fVar7 = cosf(fVar8);
  fVar8 = sinf(fVar8);
  fVar6 = fVar8 * 0.0;
  local_88 = fVar8 * fVar9 + fVar6 * fVar11 + (fVar7 * fVar10 - fVar6 * fVar12);
  fStack_84 = fVar6 * fVar9 + fVar8 * fVar12 + (fVar7 * fVar11 - fVar6 * fVar10);
  fStack_80 = fVar6 * fVar9 + fVar6 * fVar10 + (fVar7 * fVar12 - fVar8 * fVar11);
  fStack_7c = -(fVar6 * fVar11 + fVar6 * fVar12) + (fVar7 * fVar9 - fVar8 * fVar10);
  Eigen::Matrix<float,3,3,0,3,3>::operator=
            (local_44,(RotationBase<Eigen::Quaternion<float,_0>,_3> *)&local_88);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GT Rotation Matrix: ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_44);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  iVar2 = rand();
  local_88 = (float)(iVar2 % 200) / 10.0 + -10.0;
  iVar2 = rand();
  fStack_84 = (float)(iVar2 % 200) / 10.0 + -10.0;
  iVar2 = rand();
  fStack_80 = (float)(iVar2 % 200) / 10.0 + -10.0;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GT Translation Vector: ",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    poVar3 = (ostream *)std::ostream::flush();
    local_50 = (RotationBase<Eigen::Quaternion<float,_0>,_3> *)&local_88;
    poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                       *)&local_50);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  lVar4 = 0;
  pfVar5 = (float *)__return_storage_ptr__;
  do {
    pfVar5[2] = *(float *)((long)afStack_3c + lVar4);
    *(undefined8 *)pfVar5 = *(undefined8 *)(local_44 + lVar4);
    lVar4 = lVar4 + 0xc;
    pfVar5 = pfVar5 + 4;
  } while (lVar4 != 0x24);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = fStack_80;
  *(ulong *)((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
             m_storage.m_data.array + 0xc) = CONCAT44(fStack_84,local_88);
  return __return_storage_ptr__;
}

Assistant:

Matrix<floatPrec, 4, 4> getGTTransformations(bool verbose)
{

  Matrix<floatPrec, 4, 4> transOut;

  // init the output
  transOut = Matrix<floatPrec, 4, 4>::Identity(4, 4);

  floatPrec angX, angY, angZ;
  Matrix<floatPrec, 3, 3> rotGT;
  Matrix<floatPrec, 3, 1> tranGT;

  // generate random angles
  angX = (rand() % 200) / 5.0;
  angY = (rand() % 200) / 5.0;
  angZ = (rand() % 200) / 5.0;
  if (verbose)
    cout << "Rand() angles = (" << angX << "," << angY << "," << angZ << ")" << endl;

  // create a rotation matrix
  rotGT = AngleAxis<floatPrec>(angZ * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitZ()) *
          AngleAxis<floatPrec>(angY * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitY()) *
          AngleAxis<floatPrec>(angX * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitX());
  if (verbose)
    cout << "GT Rotation Matrix: " << endl
         << rotGT << endl;
  // cout << rotGT.transpose()*rotGT << endl;

  // create a translation vector
  tranGT(0) = rand() % 200 / 10.0 - 10.0;
  tranGT(1) = rand() % 200 / 10.0 - 10.0;
  tranGT(2) = rand() % 200 / 10.0 - 10.0;
  if (verbose)
    cout << "GT Translation Vector: " << endl
         << tranGT.transpose() << endl;

  transOut.topLeftCorner(3, 3) = rotGT;
  transOut.topRightCorner(3, 1) = tranGT;

  return transOut;
}